

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reduce.hpp
# Opt level: O2

BBox<1> Omega_h::
        transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<1>,Omega_h::BBox<1>,Omega_h::UniteOp<1>>
                  (Few<double,_1> param_1,Few<double,_1> param_2,int first,int last,
                  Write<signed_char> *param_5)

{
  BBox<1> BVar1;
  long lVar2;
  Few<double,_1> FVar3;
  Few<double,_1> FVar4;
  type transform_local;
  Write<signed_char> local_30;
  
  entering_parallel = 1;
  Write<double>::Write(&local_30,param_5);
  entering_parallel = 0;
  for (lVar2 = (long)first; last != lVar2; lVar2 = lVar2 + 1) {
    FVar3.array_[0] = *(double (*) [1])((long)local_30.shared_alloc_.direct_ptr + lVar2 * 8);
    FVar4.array_[0] = FVar3.array_[0];
    if ((double)param_1.array_[0] <= (double)FVar3.array_[0]) {
      FVar4.array_[0] = param_1.array_[0];
    }
    if ((double)FVar3.array_[0] <= (double)param_2.array_[0]) {
      FVar3.array_[0] = param_2.array_[0];
    }
    param_2.array_[0] = FVar3.array_[0];
    param_1.array_[0] = FVar4.array_[0];
  }
  Write<double>::~Write((Write<double> *)&local_30);
  BVar1.max.super_Few<double,_1>.array_[0] = (Few<double,_1>)(Few<double,_1>)param_2.array_[0];
  BVar1.min.super_Few<double,_1>.array_[0] = (Few<double,_1>)(Few<double,_1>)param_1.array_[0];
  return BVar1;
}

Assistant:

Result transform_reduce(
    Iterator first, Iterator last, Result init, Op op, Tranform&& transform) {
  Omega_h::entering_parallel = true;
  auto const transform_local = std::move(transform);
  Omega_h::entering_parallel = false;
  for (; first != last; ++first) {
    init = op(std::move(init), transform_local(*first));
  }
  return init;
}